

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnLocalDecl(SharedValidator *this,Location *loc,Index count,Type type)

{
  Index IVar1;
  value_type local_34;
  Enum local_2c;
  undefined4 local_28;
  Index local_24;
  uint max_locals;
  Index count_local;
  Location *loc_local;
  SharedValidator *this_local;
  Type type_local;
  
  local_28 = 0xffffffff;
  local_24 = count;
  _max_locals = loc;
  loc_local = (Location *)this;
  this_local._0_4_ = type.enum_;
  IVar1 = GetLocalCount(this);
  if (-IVar1 - 1 < count) {
    local_2c = (Enum)PrintError(this,_max_locals,"local count must be < 0x10000000");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_34.type.enum_ = this_local._0_4_;
    local_34.end = GetLocalCount(this);
    local_34.end = local_34.end + local_24;
    std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ::push_back(&this->locals_,&local_34);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnLocalDecl(const Location& loc,
                                    Index count,
                                    Type type) {
  const auto max_locals = std::numeric_limits<Index>::max();
  if (count > max_locals - GetLocalCount()) {
    PrintError(loc, "local count must be < 0x10000000");
    return Result::Error;
  }
  locals_.push_back(LocalDecl{type, GetLocalCount() + count});
  return Result::Ok;
}